

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_AST.h
# Opt level: O0

SliceRange __thiscall soul::AST::ArrayElementRef::getResolvedSliceRange(ArrayElementRef *this)

{
  bool bVar1;
  Expression *pEVar2;
  Constant *pCVar3;
  ArrayElementRef *pAVar4;
  ArraySize AVar5;
  pool_ptr<soul::AST::Constant> local_68;
  pool_ptr<soul::AST::Constant> c_1;
  Type type;
  pool_ptr<soul::AST::Constant> local_38;
  pool_ptr<soul::AST::Constant> c;
  int64_t end;
  int64_t start;
  ArrayElementRef *this_local;
  ArraySize local_10;
  
  bVar1 = isSliceRangeValid(this);
  checkAssertion(bVar1,"isSliceRangeValid()","getResolvedSliceRange",0x9a4);
  end = 0;
  c.object = (Constant *)0x0;
  pEVar2 = pool_ptr<soul::AST::Expression>::operator->(&this->startIndex);
  (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_38);
  bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_38);
  if (bVar1) {
    pCVar3 = pool_ptr<soul::AST::Constant>::operator->(&local_38);
    end = soul::Value::getAsInt64(&pCVar3->value);
  }
  pool_ptr<soul::AST::Constant>::~pool_ptr(&local_38);
  pEVar2 = pool_ptr<soul::AST::Expression>::operator->(&this->object);
  (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[4])(&c_1);
  bVar1 = pool_ptr<soul::AST::Expression>::operator==(&this->endIndex,(void *)0x0);
  if (bVar1) {
    c.object = (Constant *)Type::getArrayOrVectorSize((Type *)&c_1);
  }
  else {
    pEVar2 = pool_ptr<soul::AST::Expression>::operator->(&this->endIndex);
    (*(pEVar2->super_Statement).super_ASTObject._vptr_ASTObject[0xd])(&local_68);
    bVar1 = soul::pool_ptr::operator_cast_to_bool((pool_ptr *)&local_68);
    if (bVar1) {
      pCVar3 = pool_ptr<soul::AST::Constant>::operator->(&local_68);
      c.object = (Constant *)soul::Value::getAsInt64(&pCVar3->value);
    }
    pool_ptr<soul::AST::Constant>::~pool_ptr(&local_68);
  }
  pAVar4 = (ArrayElementRef *)Type::convertArrayOrVectorIndexToValidRange<long>((Type *)&c_1,end);
  this_local = pAVar4;
  AVar5 = Type::convertArrayOrVectorIndexToValidRange<long>((Type *)&c_1,(long)c.object);
  local_10 = AVar5;
  Type::~Type((Type *)&c_1);
  return _this_local;
}

Assistant:

SliceRange getResolvedSliceRange() const
        {
            SOUL_ASSERT (isSliceRangeValid());
            int64_t start = 0, end = 0;

            if (auto c = startIndex->getAsConstant())
                start = c->value.getAsInt64();

            auto type = object->getResultType();

            if (endIndex == nullptr)
                end = (int64_t) type.getArrayOrVectorSize();
            else if (auto c = endIndex->getAsConstant())
                end = c->value.getAsInt64();

            return { type.convertArrayOrVectorIndexToValidRange (start),
                     type.convertArrayOrVectorIndexToValidRange (end) };
        }